

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

void cpsm::
     str_cat_impl<char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
               (stringstream *ss,char **x,unsigned_long args,char *args_1,unsigned_long args_2,
               char *args_3,unsigned_long args_4,char *args_5,unsigned_long args_6,char *args_7,
               unsigned_long args_8)

{
  unsigned_long *in_RCX;
  stringstream *in_RDX;
  unsigned_long unaff_RBX;
  undefined8 *in_RSI;
  char *in_RDI;
  char *in_R8;
  unsigned_long in_R9;
  char *unaff_retaddr;
  unsigned_long in_stack_00000008;
  
  std::operator<<((ostream *)(in_RDI + 0x10),(char *)*in_RSI);
  str_cat_impl<unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
            (in_RDX,in_RCX,in_R8,in_R9,(char *)args_2,(unsigned_long)args_3,in_RDI,unaff_RBX,
             unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}